

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void __thiscall
Json::Reader::getLocationLineAndColumn(Reader *this,Location location,int *line,int *column)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = this->begin_;
  *line = 0;
  iVar1 = 0;
  do {
    pcVar4 = pcVar2;
    do {
      pcVar3 = pcVar4;
      if ((location <= pcVar3) || (pcVar3 == this->end_)) {
        *column = ((int)location - (int)pcVar2) + 1;
        *line = *line + 1;
        return;
      }
      pcVar4 = pcVar3 + 1;
      if (*pcVar3 == '\n') goto LAB_004df9e1;
    } while (*pcVar3 != '\r');
    if (*pcVar4 == '\n') {
      pcVar4 = pcVar3 + 2;
    }
LAB_004df9e1:
    iVar1 = iVar1 + 1;
    *line = iVar1;
    pcVar2 = pcVar4;
  } while( true );
}

Assistant:

void Reader::getLocationLineAndColumn(Location location,
                                      int& line,
                                      int& column) const {
  Location current = begin_;
  Location lastLineStart = current;
  line = 0;
  while (current < location && current != end_) {
    Char c = *current++;
    if (c == '\r') {
      if (*current == '\n')
        ++current;
      lastLineStart = current;
      ++line;
    } else if (c == '\n') {
      lastLineStart = current;
      ++line;
    }
  }
  // column & line start at 1
  column = int(location - lastLineStart) + 1;
  ++line;
}